

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall kj::_::ForkHub<kj::_::Void>::addBranch(ForkHub<kj::_::Void> *this)

{
  Own<kj::_::ForkBranch<kj::_::Void,_true>,_kj::_::PromiseDisposer> OVar1;
  long in_RSI;
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase> local_28;
  Own<kj::_::ForkBranch<kj::_::Void,_true>,_kj::_::PromiseDisposer> local_20;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18;
  
  *(int *)(in_RSI + 0x50) = *(int *)(in_RSI + 0x50) + 1;
  PromiseDisposer::
  alloc<kj::_::ForkBranch<kj::_::Void,true>,kj::_::PromiseDisposer,kj::Own<kj::_::ForkHubBase,kj::_::ForkHubBase>>
            ((PromiseDisposer *)&local_20,&local_28);
  OVar1.ptr = local_20.ptr;
  local_20.ptr = (ForkBranch<kj::_::Void,_true> *)0x0;
  (this->super_ForkHubBase).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)OVar1.ptr;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18);
  Own<kj::_::ForkBranch<kj::_::Void,_true>,_kj::_::PromiseDisposer>::dispose(&local_20);
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase>::dispose(&local_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Own<ForkHubBase, ForkHubBase> addRef() {
    ++refcount;
    return Own<ForkHubBase, ForkHubBase>(this);
  }